

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseExpression(Parser *this)

{
  int in_ESI;
  CalculationEngine *local_20;
  
  parseUnaryExpression((Parser *)&stack0xffffffffffffffe0);
  parseBinaryOpRHS(this,in_ESI,(unique_ptr<Expression,_std::default_delete<Expression>_> *)0x0);
  if (local_20 != (CalculationEngine *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseExpression() {
	return parseBinaryOpRHS(0, parseUnaryExpression());
}